

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                   *this,arrays_type *new_arrays_)

{
  size_t sVar1;
  size_t sVar2;
  anon_class_8_1_8991fb9c in_RSI;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  *in_RDI;
  size_t num_destroyed;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  *this_01;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  *in_stack_ffffffffffffffa0;
  anon_class_24_3_45a051ed in_stack_ffffffffffffffb0;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  *local_10;
  
  local_18 = 0;
  this_01 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             *)&stack0xffffffffffffffe8;
  this_00 = in_RDI;
  local_10 = in_RSI.this;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>::unchecked_rehash(boost::unordered::detail::foa::table_arrays<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>&)::_lambda(std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>*)_1_>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0);
  sVar2 = local_18;
  sVar1 = size(in_RDI);
  if (sVar2 != sVar1) {
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>::unchecked_rehash(boost::unordered::detail::foa::table_arrays<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>&)::_lambda(std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>*)_3_>
              (this_00,in_RSI);
  }
  delete_arrays(in_RSI.this,&this_00->arrays);
  (in_RDI->arrays).groups_size_index = (local_10->arrays).groups_size_index;
  (in_RDI->arrays).groups_size_mask = (local_10->arrays).groups_size_mask;
  (in_RDI->arrays).groups_ = (local_10->arrays).groups_;
  (in_RDI->arrays).elements_ = (local_10->arrays).elements_;
  sVar2 = initial_max_load(this_01);
  (in_RDI->size_ctrl).ml = sVar2;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }